

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O1

void __thiscall
embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *patch)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 *puVar5;
  int iVar6;
  Vec3fa *pVVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t i;
  long lVar10;
  Vec3fa *pVVar11;
  Vec3fa *pVVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Vec3fa center_ring [8];
  long local_238 [65];
  
  patch->items[0].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].vertex_level = (this->ring).items[0].vertex_level * 0.5;
  patch->items[0].ring.items[0].face_valence = (this->ring).items[0].face_valence;
  patch->items[0].ring.items[0].edge_valence = (this->ring).items[0].edge_valence;
  patch->items[0].ring.items[0].border_index = (this->ring).items[0].border_index;
  fVar24 = (this->ring).items[0].vertex_crease_weight + -1.0;
  if (fVar24 <= 0.0) {
    fVar24 = 0.0;
  }
  patch->items[0].ring.items[0].vertex_crease_weight = fVar24;
  patch->items[0].ring.items[0].eval_start_index = (this->ring).items[0].eval_start_index;
  patch->items[0].ring.items[0].eval_unique_identifier =
       (this->ring).items[0].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[0].face_valence;
  if (uVar16 == 0) {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
  }
  else {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[0].edge_valence;
      uVar18 = (this->ring).items[0].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[0].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar26 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[0].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar27 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[0].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar28 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[0].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar29 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[0].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[0].ring.items[0].ring.data
          == &patch->items[0].ring.items[0].ring)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
      }
      pVVar12 = patch->items[0].ring.items[0].ring.data + lVar10;
      (pVVar12->field_0).m128[0] = fVar26;
      (pVVar12->field_0).m128[1] = fVar27;
      (pVVar12->field_0).m128[2] = fVar28;
      (pVVar12->field_0).m128[3] = fVar29;
      fVar24 = fVar24 + fVar26;
      fVar30 = fVar30 + fVar27;
      fVar31 = fVar31 + fVar28;
      fVar32 = fVar32 + fVar29;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[0].face_valence;
    } while (uVar23 < uVar16);
  }
  uVar16 = (ulong)(this->ring).items[0].face_valence;
  if (uVar16 == 0) {
    uVar20 = 0;
    uVar16 = 0;
  }
  else {
    pDVar2 = &patch->items[0].ring.items[0].ring;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar18 = (this->ring).items[0].eval_start_index + uVar23;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar26 = (this->ring).items[0].crease_weight.data[lVar19];
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[0].ring.items[0].crease_weight.data
          == &patch->items[0].ring.items[0].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[0].ring.items[0].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[0].ring.items[0].crease_weight.data[lVar10] =
               patch->items[0].ring.items[0].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      fVar27 = 0.0;
      if (0.0 <= fVar26 + -1.0) {
        fVar27 = fVar26 + -1.0;
      }
      patch->items[0].ring.items[0].crease_weight.data[lVar19] = fVar27;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[0].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[0].ring.data + lVar19 * 2;
      fVar27 = (this->ring).items[0].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar28 = (this->ring).items[0].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar29 = (this->ring).items[0].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar33 = (this->ring).items[0].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[0].ring.items[0].ring.data
          == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      uVar15 = lVar19 * 2;
      pVVar12 = patch->items[0].ring.items[0].ring.data;
      if ((0x20 < uVar15 + 2) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[0].ring.items[0].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = patch->items[0].ring.items[0].ring.data;
      pVVar11 = pVVar7 + lVar19 * 2 + 1;
      fVar34 = (pVVar12->field_0).m128[0] + (pVVar11->field_0).m128[0];
      fVar35 = (pVVar12->field_0).m128[1] + (pVVar11->field_0).m128[1];
      fVar36 = (pVVar12->field_0).m128[2] + (pVVar11->field_0).m128[2];
      fVar37 = (pVVar12->field_0).m128[3] + (pVVar11->field_0).m128[3];
      pVVar12 = (this->ring).items[0].ring.data + lVar19 * 2;
      fVar24 = fVar24 + (pVVar12->field_0).m128[0];
      fVar30 = fVar30 + (pVVar12->field_0).m128[1];
      fVar31 = fVar31 + (pVVar12->field_0).m128[2];
      fVar32 = fVar32 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar26) {
        local_238[uVar20] = lVar19;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[0].ring.items[0].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
        uVar20 = uVar20 + 1;
        pVVar12 = patch->items[0].ring.items[0].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27 * 0.5;
        (pVVar12->field_0).m128[1] = fVar28 * 0.5;
        (pVVar12->field_0).m128[2] = fVar29 * 0.5;
        (pVVar12->field_0).m128[3] = fVar33 * 0.5;
        if (fVar26 < 1.0) {
          fVar25 = 1.0 - fVar26;
          fVar27 = (fVar27 + fVar34) * 0.25 * fVar25 + fVar26 * fVar27 * 0.5;
          fVar28 = (fVar28 + fVar35) * 0.25 * fVar25 + fVar26 * fVar28 * 0.5;
          fVar29 = (fVar29 + fVar36) * 0.25 * fVar25 + fVar26 * fVar29 * 0.5;
          fVar26 = (fVar33 + fVar37) * 0.25 * fVar25 + fVar26 * fVar33 * 0.5;
          if ((0x20 < (uVar15 | 1)) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[0].ring.items[0].ring.data == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[0].ring.items[0].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
          }
          goto LAB_00e4e6a4;
        }
      }
      else {
        fVar27 = (fVar27 + fVar34) * 0.25;
        fVar28 = (fVar28 + fVar35) * 0.25;
        fVar29 = (fVar29 + fVar36) * 0.25;
        fVar26 = (fVar33 + fVar37) * 0.25;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[0].ring.items[0].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
LAB_00e4e6a4:
        pVVar12 = patch->items[0].ring.items[0].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27;
        (pVVar12->field_0).m128[1] = fVar28;
        (pVVar12->field_0).m128[2] = fVar29;
        (pVVar12->field_0).m128[3] = fVar26;
      }
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[0].face_valence;
    } while (uVar23 < uVar16);
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar27 = 1.0 / (float)uVar16;
  fVar26 = (float)uVar16 + -2.0;
  fVar28 = (fVar24 * fVar27 + fVar26 * (this->ring).items[0].vtx.field_0.m128[0]) * fVar27;
  fVar30 = (fVar30 * fVar27 + fVar26 * (this->ring).items[0].vtx.field_0.m128[1]) * fVar27;
  fVar31 = (fVar31 * fVar27 + fVar26 * (this->ring).items[0].vtx.field_0.m128[2]) * fVar27;
  fVar27 = (fVar32 * fVar27 + fVar26 * (this->ring).items[0].vtx.field_0.m128[3]) * fVar27;
  patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar28;
  patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar30;
  patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar31;
  patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar27;
  fVar24 = (this->ring).items[0].vertex_crease_weight;
  if (0.0 < fVar24) {
    if (1.0 <= fVar24) {
LAB_00e51df9:
      fVar32 = (this->ring).items[0].vtx.field_0.m128[0];
      fVar30 = (this->ring).items[0].vtx.field_0.m128[1];
      fVar31 = (this->ring).items[0].vtx.field_0.m128[2];
      fVar24 = (this->ring).items[0].vtx.field_0.m128[3];
    }
    else {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar24 * (this->ring).items[0].vtx.field_0.m128[0];
      fVar30 = fVar30 * fVar26 + fVar24 * (this->ring).items[0].vtx.field_0.m128[1];
      fVar31 = fVar31 * fVar26 + fVar24 * (this->ring).items[0].vtx.field_0.m128[2];
      fVar24 = fVar27 * fVar26 + fVar24 * (this->ring).items[0].vtx.field_0.m128[3];
    }
LAB_00e51e01:
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar32;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar30;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar31;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar24;
  }
  else if (1 < uVar20) {
    if (uVar20 != 2) goto LAB_00e51df9;
    pVVar11 = (this->ring).items[0].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar33 = ((this->ring).items[0].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar34 = ((this->ring).items[0].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar35 = ((this->ring).items[0].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar36 = ((this->ring).items[0].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar33;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar34;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar35;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar36;
    pfVar14 = (this->ring).items[0].crease_weight.data;
    fVar24 = pfVar14[local_238[0]];
    fVar32 = pfVar14[local_238[1]];
    fVar29 = (fVar24 * 3.0 + fVar32) * 0.25 + -1.0;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    pDVar1 = &patch->items[0].ring.items[0].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[0].ring.items[0].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[0].ring.items[0].crease_weight.data[lVar13] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    fVar29 = (fVar32 * 3.0 + fVar24) * 0.25 + -1.0;
    patch->items[0].ring.items[0].crease_weight.data[lVar19] = fVar26;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    if ((0x10 < lVar10 + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[0].ring.items[0].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[0].ring.items[0].crease_weight.data[lVar19] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    patch->items[0].ring.items[0].crease_weight.data[lVar10] = fVar26;
    fVar24 = (fVar24 + fVar32) * 0.5;
    if (fVar24 < 1.0) {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar33 * fVar24;
      fVar30 = fVar30 * fVar26 + fVar34 * fVar24;
      fVar31 = fVar31 * fVar26 + fVar35 * fVar24;
      fVar24 = fVar27 * fVar26 + fVar36 * fVar24;
      goto LAB_00e51e01;
    }
  }
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[1].vertex_level = (this->ring).items[1].vertex_level * 0.5;
  patch->items[1].ring.items[1].face_valence = (this->ring).items[1].face_valence;
  patch->items[1].ring.items[1].edge_valence = (this->ring).items[1].edge_valence;
  patch->items[1].ring.items[1].border_index = (this->ring).items[1].border_index;
  fVar24 = (this->ring).items[1].vertex_crease_weight + -1.0;
  if (fVar24 <= 0.0) {
    fVar24 = 0.0;
  }
  patch->items[1].ring.items[1].vertex_crease_weight = fVar24;
  patch->items[1].ring.items[1].eval_start_index = (this->ring).items[1].eval_start_index;
  patch->items[1].ring.items[1].eval_unique_identifier =
       (this->ring).items[1].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[1].face_valence;
  if (uVar16 == 0) {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
  }
  else {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[1].edge_valence;
      uVar18 = (this->ring).items[1].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[1].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar26 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[1].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar27 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[1].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar28 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[1].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar29 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[1].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[1].ring.items[1].ring.data
          == &patch->items[1].ring.items[1].ring)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
      }
      pVVar12 = patch->items[1].ring.items[1].ring.data + lVar10;
      (pVVar12->field_0).m128[0] = fVar26;
      (pVVar12->field_0).m128[1] = fVar27;
      (pVVar12->field_0).m128[2] = fVar28;
      (pVVar12->field_0).m128[3] = fVar29;
      fVar24 = fVar24 + fVar26;
      fVar30 = fVar30 + fVar27;
      fVar31 = fVar31 + fVar28;
      fVar32 = fVar32 + fVar29;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[1].face_valence;
    } while (uVar23 < uVar16);
  }
  uVar16 = (ulong)(this->ring).items[1].face_valence;
  if (uVar16 == 0) {
    uVar20 = 0;
    uVar16 = 0;
  }
  else {
    pDVar2 = &patch->items[1].ring.items[1].ring;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar18 = (this->ring).items[1].eval_start_index + uVar23;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar26 = (this->ring).items[1].crease_weight.data[lVar19];
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[1].ring.items[1].crease_weight.data
          == &patch->items[1].ring.items[1].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[1].ring.items[1].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[1].ring.items[1].crease_weight.data[lVar10] =
               patch->items[1].ring.items[1].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      fVar27 = 0.0;
      if (0.0 <= fVar26 + -1.0) {
        fVar27 = fVar26 + -1.0;
      }
      patch->items[1].ring.items[1].crease_weight.data[lVar19] = fVar27;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[1].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[1].ring.data + lVar19 * 2;
      fVar27 = (this->ring).items[1].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar28 = (this->ring).items[1].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar29 = (this->ring).items[1].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar33 = (this->ring).items[1].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[1].ring.items[1].ring.data
          == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      uVar15 = lVar19 * 2;
      pVVar12 = patch->items[1].ring.items[1].ring.data;
      if ((0x20 < uVar15 + 2) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[1].ring.items[1].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = patch->items[1].ring.items[1].ring.data;
      pVVar11 = pVVar7 + lVar19 * 2 + 1;
      fVar34 = (pVVar12->field_0).m128[0] + (pVVar11->field_0).m128[0];
      fVar35 = (pVVar12->field_0).m128[1] + (pVVar11->field_0).m128[1];
      fVar36 = (pVVar12->field_0).m128[2] + (pVVar11->field_0).m128[2];
      fVar37 = (pVVar12->field_0).m128[3] + (pVVar11->field_0).m128[3];
      pVVar12 = (this->ring).items[1].ring.data + lVar19 * 2;
      fVar24 = fVar24 + (pVVar12->field_0).m128[0];
      fVar30 = fVar30 + (pVVar12->field_0).m128[1];
      fVar31 = fVar31 + (pVVar12->field_0).m128[2];
      fVar32 = fVar32 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar26) {
        local_238[uVar20] = lVar19;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[1].ring.items[1].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
        uVar20 = uVar20 + 1;
        pVVar12 = patch->items[1].ring.items[1].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27 * 0.5;
        (pVVar12->field_0).m128[1] = fVar28 * 0.5;
        (pVVar12->field_0).m128[2] = fVar29 * 0.5;
        (pVVar12->field_0).m128[3] = fVar33 * 0.5;
        if (fVar26 < 1.0) {
          fVar25 = 1.0 - fVar26;
          fVar27 = (fVar27 + fVar34) * 0.25 * fVar25 + fVar26 * fVar27 * 0.5;
          fVar28 = (fVar28 + fVar35) * 0.25 * fVar25 + fVar26 * fVar28 * 0.5;
          fVar29 = (fVar29 + fVar36) * 0.25 * fVar25 + fVar26 * fVar29 * 0.5;
          fVar26 = (fVar33 + fVar37) * 0.25 * fVar25 + fVar26 * fVar33 * 0.5;
          if ((0x20 < (uVar15 | 1)) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[1].ring.items[1].ring.data == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[1].ring.items[1].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
          }
          goto LAB_00e4eeab;
        }
      }
      else {
        fVar27 = (fVar27 + fVar34) * 0.25;
        fVar28 = (fVar28 + fVar35) * 0.25;
        fVar29 = (fVar29 + fVar36) * 0.25;
        fVar26 = (fVar33 + fVar37) * 0.25;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[1].ring.items[1].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
LAB_00e4eeab:
        pVVar12 = patch->items[1].ring.items[1].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27;
        (pVVar12->field_0).m128[1] = fVar28;
        (pVVar12->field_0).m128[2] = fVar29;
        (pVVar12->field_0).m128[3] = fVar26;
      }
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[1].face_valence;
    } while (uVar23 < uVar16);
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar27 = 1.0 / (float)uVar16;
  fVar26 = (float)uVar16 + -2.0;
  fVar28 = (fVar24 * fVar27 + fVar26 * (this->ring).items[1].vtx.field_0.m128[0]) * fVar27;
  fVar30 = (fVar30 * fVar27 + fVar26 * (this->ring).items[1].vtx.field_0.m128[1]) * fVar27;
  fVar31 = (fVar31 * fVar27 + fVar26 * (this->ring).items[1].vtx.field_0.m128[2]) * fVar27;
  fVar27 = (fVar32 * fVar27 + fVar26 * (this->ring).items[1].vtx.field_0.m128[3]) * fVar27;
  patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar28;
  patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar30;
  patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar31;
  patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar27;
  fVar24 = (this->ring).items[1].vertex_crease_weight;
  if (0.0 < fVar24) {
    if (1.0 <= fVar24) {
LAB_00e51e0e:
      fVar32 = (this->ring).items[1].vtx.field_0.m128[0];
      fVar30 = (this->ring).items[1].vtx.field_0.m128[1];
      fVar31 = (this->ring).items[1].vtx.field_0.m128[2];
      fVar24 = (this->ring).items[1].vtx.field_0.m128[3];
    }
    else {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar24 * (this->ring).items[1].vtx.field_0.m128[0];
      fVar30 = fVar30 * fVar26 + fVar24 * (this->ring).items[1].vtx.field_0.m128[1];
      fVar31 = fVar31 * fVar26 + fVar24 * (this->ring).items[1].vtx.field_0.m128[2];
      fVar24 = fVar27 * fVar26 + fVar24 * (this->ring).items[1].vtx.field_0.m128[3];
    }
LAB_00e51e16:
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar32;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar30;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar31;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar24;
  }
  else if (1 < uVar20) {
    if (uVar20 != 2) goto LAB_00e51e0e;
    pVVar11 = (this->ring).items[1].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar33 = ((this->ring).items[1].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar34 = ((this->ring).items[1].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar35 = ((this->ring).items[1].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar36 = ((this->ring).items[1].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar33;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar34;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar35;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar36;
    pfVar14 = (this->ring).items[1].crease_weight.data;
    fVar24 = pfVar14[local_238[0]];
    fVar32 = pfVar14[local_238[1]];
    fVar29 = (fVar24 * 3.0 + fVar32) * 0.25 + -1.0;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    pDVar1 = &patch->items[1].ring.items[1].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[1].ring.items[1].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[1].ring.items[1].crease_weight.data[lVar13] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    fVar29 = (fVar32 * 3.0 + fVar24) * 0.25 + -1.0;
    patch->items[1].ring.items[1].crease_weight.data[lVar19] = fVar26;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    if ((0x10 < lVar10 + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[1].ring.items[1].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[1].ring.items[1].crease_weight.data[lVar19] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    patch->items[1].ring.items[1].crease_weight.data[lVar10] = fVar26;
    fVar24 = (fVar24 + fVar32) * 0.5;
    if (fVar24 < 1.0) {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar33 * fVar24;
      fVar30 = fVar30 * fVar26 + fVar34 * fVar24;
      fVar31 = fVar31 * fVar26 + fVar35 * fVar24;
      fVar24 = fVar27 * fVar26 + fVar36 * fVar24;
      goto LAB_00e51e16;
    }
  }
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[2].vertex_level = (this->ring).items[2].vertex_level * 0.5;
  patch->items[2].ring.items[2].face_valence = (this->ring).items[2].face_valence;
  patch->items[2].ring.items[2].edge_valence = (this->ring).items[2].edge_valence;
  patch->items[2].ring.items[2].border_index = (this->ring).items[2].border_index;
  fVar24 = (this->ring).items[2].vertex_crease_weight + -1.0;
  if (fVar24 <= 0.0) {
    fVar24 = 0.0;
  }
  patch->items[2].ring.items[2].vertex_crease_weight = fVar24;
  patch->items[2].ring.items[2].eval_start_index = (this->ring).items[2].eval_start_index;
  patch->items[2].ring.items[2].eval_unique_identifier =
       (this->ring).items[2].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[2].face_valence;
  if (uVar16 == 0) {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
  }
  else {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[2].edge_valence;
      uVar18 = (this->ring).items[2].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[2].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar26 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[2].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar27 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[2].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar28 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[2].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar29 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[2].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[2].ring.items[2].ring.data
          == &patch->items[2].ring.items[2].ring)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
      }
      pVVar12 = patch->items[2].ring.items[2].ring.data + lVar10;
      (pVVar12->field_0).m128[0] = fVar26;
      (pVVar12->field_0).m128[1] = fVar27;
      (pVVar12->field_0).m128[2] = fVar28;
      (pVVar12->field_0).m128[3] = fVar29;
      fVar24 = fVar24 + fVar26;
      fVar30 = fVar30 + fVar27;
      fVar31 = fVar31 + fVar28;
      fVar32 = fVar32 + fVar29;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[2].face_valence;
    } while (uVar23 < uVar16);
  }
  uVar16 = (ulong)(this->ring).items[2].face_valence;
  if (uVar16 == 0) {
    uVar20 = 0;
    uVar16 = 0;
  }
  else {
    pDVar2 = &patch->items[2].ring.items[2].ring;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar18 = (this->ring).items[2].eval_start_index + uVar23;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar26 = (this->ring).items[2].crease_weight.data[lVar19];
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[2].ring.items[2].crease_weight.data
          == &patch->items[2].ring.items[2].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[2].ring.items[2].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[2].ring.items[2].crease_weight.data[lVar10] =
               patch->items[2].ring.items[2].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      fVar27 = 0.0;
      if (0.0 <= fVar26 + -1.0) {
        fVar27 = fVar26 + -1.0;
      }
      patch->items[2].ring.items[2].crease_weight.data[lVar19] = fVar27;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[2].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[2].ring.data + lVar19 * 2;
      fVar27 = (this->ring).items[2].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar28 = (this->ring).items[2].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar29 = (this->ring).items[2].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar33 = (this->ring).items[2].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[2].ring.items[2].ring.data
          == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      uVar15 = lVar19 * 2;
      pVVar12 = patch->items[2].ring.items[2].ring.data;
      if ((0x20 < uVar15 + 2) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[2].ring.items[2].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = patch->items[2].ring.items[2].ring.data;
      pVVar11 = pVVar7 + lVar19 * 2 + 1;
      fVar34 = (pVVar12->field_0).m128[0] + (pVVar11->field_0).m128[0];
      fVar35 = (pVVar12->field_0).m128[1] + (pVVar11->field_0).m128[1];
      fVar36 = (pVVar12->field_0).m128[2] + (pVVar11->field_0).m128[2];
      fVar37 = (pVVar12->field_0).m128[3] + (pVVar11->field_0).m128[3];
      pVVar12 = (this->ring).items[2].ring.data + lVar19 * 2;
      fVar24 = fVar24 + (pVVar12->field_0).m128[0];
      fVar30 = fVar30 + (pVVar12->field_0).m128[1];
      fVar31 = fVar31 + (pVVar12->field_0).m128[2];
      fVar32 = fVar32 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar26) {
        local_238[uVar20] = lVar19;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[2].ring.items[2].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
        uVar20 = uVar20 + 1;
        pVVar12 = patch->items[2].ring.items[2].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27 * 0.5;
        (pVVar12->field_0).m128[1] = fVar28 * 0.5;
        (pVVar12->field_0).m128[2] = fVar29 * 0.5;
        (pVVar12->field_0).m128[3] = fVar33 * 0.5;
        if (fVar26 < 1.0) {
          fVar25 = 1.0 - fVar26;
          fVar27 = (fVar27 + fVar34) * 0.25 * fVar25 + fVar26 * fVar27 * 0.5;
          fVar28 = (fVar28 + fVar35) * 0.25 * fVar25 + fVar26 * fVar28 * 0.5;
          fVar29 = (fVar29 + fVar36) * 0.25 * fVar25 + fVar26 * fVar29 * 0.5;
          fVar26 = (fVar33 + fVar37) * 0.25 * fVar25 + fVar26 * fVar33 * 0.5;
          if ((0x20 < (uVar15 | 1)) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[2].ring.items[2].ring.data == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[2].ring.items[2].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
          }
          goto LAB_00e4f6bb;
        }
      }
      else {
        fVar27 = (fVar27 + fVar34) * 0.25;
        fVar28 = (fVar28 + fVar35) * 0.25;
        fVar29 = (fVar29 + fVar36) * 0.25;
        fVar26 = (fVar33 + fVar37) * 0.25;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[2].ring.items[2].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
LAB_00e4f6bb:
        pVVar12 = patch->items[2].ring.items[2].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27;
        (pVVar12->field_0).m128[1] = fVar28;
        (pVVar12->field_0).m128[2] = fVar29;
        (pVVar12->field_0).m128[3] = fVar26;
      }
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[2].face_valence;
    } while (uVar23 < uVar16);
  }
  lVar10 = local_238[1];
  lVar19 = local_238[0];
  fVar27 = 1.0 / (float)uVar16;
  fVar26 = (float)uVar16 + -2.0;
  fVar28 = (fVar24 * fVar27 + fVar26 * (this->ring).items[2].vtx.field_0.m128[0]) * fVar27;
  fVar30 = (fVar30 * fVar27 + fVar26 * (this->ring).items[2].vtx.field_0.m128[1]) * fVar27;
  fVar31 = (fVar31 * fVar27 + fVar26 * (this->ring).items[2].vtx.field_0.m128[2]) * fVar27;
  fVar27 = (fVar32 * fVar27 + fVar26 * (this->ring).items[2].vtx.field_0.m128[3]) * fVar27;
  patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar28;
  patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar30;
  patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar31;
  patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar27;
  fVar24 = (this->ring).items[2].vertex_crease_weight;
  if (0.0 < fVar24) {
    if (1.0 <= fVar24) {
LAB_00e51e23:
      fVar32 = (this->ring).items[2].vtx.field_0.m128[0];
      fVar30 = (this->ring).items[2].vtx.field_0.m128[1];
      fVar31 = (this->ring).items[2].vtx.field_0.m128[2];
      fVar24 = (this->ring).items[2].vtx.field_0.m128[3];
    }
    else {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar24 * (this->ring).items[2].vtx.field_0.m128[0];
      fVar30 = fVar30 * fVar26 + fVar24 * (this->ring).items[2].vtx.field_0.m128[1];
      fVar31 = fVar31 * fVar26 + fVar24 * (this->ring).items[2].vtx.field_0.m128[2];
      fVar24 = fVar27 * fVar26 + fVar24 * (this->ring).items[2].vtx.field_0.m128[3];
    }
LAB_00e51e2b:
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar32;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar30;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar31;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar24;
  }
  else if (1 < uVar20) {
    if (uVar20 != 2) goto LAB_00e51e23;
    pVVar11 = (this->ring).items[2].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar33 = ((this->ring).items[2].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar34 = ((this->ring).items[2].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar35 = ((this->ring).items[2].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar36 = ((this->ring).items[2].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar33;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar34;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar35;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar36;
    pfVar14 = (this->ring).items[2].crease_weight.data;
    fVar24 = pfVar14[local_238[0]];
    fVar32 = pfVar14[local_238[1]];
    fVar29 = (fVar24 * 3.0 + fVar32) * 0.25 + -1.0;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    pDVar1 = &patch->items[2].ring.items[2].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[2].ring.items[2].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar14;
      lVar13 = 0;
      do {
        patch->items[2].ring.items[2].crease_weight.data[lVar13] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    fVar29 = (fVar32 * 3.0 + fVar24) * 0.25 + -1.0;
    patch->items[2].ring.items[2].crease_weight.data[lVar19] = fVar26;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    if ((0x10 < lVar10 + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[2].ring.items[2].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[2].ring.items[2].crease_weight.data[lVar19] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    patch->items[2].ring.items[2].crease_weight.data[lVar10] = fVar26;
    fVar24 = (fVar24 + fVar32) * 0.5;
    if (fVar24 < 1.0) {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar33 * fVar24;
      fVar30 = fVar30 * fVar26 + fVar34 * fVar24;
      fVar31 = fVar31 * fVar26 + fVar35 * fVar24;
      fVar24 = fVar27 * fVar26 + fVar36 * fVar24;
      goto LAB_00e51e2b;
    }
  }
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[3].ring.items[3].vertex_level = (this->ring).items[3].vertex_level * 0.5;
  patch->items[3].ring.items[3].face_valence = (this->ring).items[3].face_valence;
  patch->items[3].ring.items[3].edge_valence = (this->ring).items[3].edge_valence;
  patch->items[3].ring.items[3].border_index = (this->ring).items[3].border_index;
  fVar24 = (this->ring).items[3].vertex_crease_weight + -1.0;
  if (fVar24 <= 0.0) {
    fVar24 = 0.0;
  }
  patch->items[3].ring.items[3].vertex_crease_weight = fVar24;
  patch->items[3].ring.items[3].eval_start_index = (this->ring).items[3].eval_start_index;
  patch->items[3].ring.items[3].eval_unique_identifier =
       (this->ring).items[3].eval_unique_identifier;
  uVar16 = (ulong)(this->ring).items[3].face_valence;
  if (uVar16 == 0) {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
  }
  else {
    fVar24 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar15 = (ulong)(this->ring).items[3].edge_valence;
      uVar18 = (this->ring).items[3].eval_start_index + uVar23;
      if (uVar18 < uVar16) {
        uVar16 = uVar20;
      }
      lVar19 = uVar18 - uVar16;
      uVar16 = uVar15;
      if ((ulong)(lVar19 * 2) < uVar15) {
        uVar16 = uVar20;
      }
      uVar18 = lVar19 * 2 + 1;
      uVar22 = uVar15;
      if (uVar18 < uVar15) {
        uVar22 = uVar20;
      }
      lVar10 = uVar18 - uVar22;
      uVar18 = lVar19 * 2 + 2;
      if (uVar18 < uVar15) {
        uVar15 = uVar20;
      }
      pVVar7 = (this->ring).items[3].ring.data;
      pVVar12 = pVVar7 + lVar10;
      pVVar11 = pVVar7 + (lVar19 * 2 - uVar16);
      pVVar7 = pVVar7 + (uVar18 - uVar15);
      fVar26 = ((pVVar11->field_0).m128[0] + (pVVar7->field_0).m128[0] +
               (this->ring).items[3].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0]) * 0.25;
      fVar27 = ((pVVar11->field_0).m128[1] + (pVVar7->field_0).m128[1] +
               (this->ring).items[3].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1]) * 0.25;
      fVar28 = ((pVVar11->field_0).m128[2] + (pVVar7->field_0).m128[2] +
               (this->ring).items[3].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2]) * 0.25;
      fVar29 = ((pVVar11->field_0).m128[3] + (pVVar7->field_0).m128[3] +
               (this->ring).items[3].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3]) * 0.25;
      if ((0x20 < lVar10 + 1U) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[3].ring.items[3].ring.data
          == &patch->items[3].ring.items[3].ring)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar12;
        lVar19 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar19)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x200);
      }
      pVVar12 = patch->items[3].ring.items[3].ring.data + lVar10;
      (pVVar12->field_0).m128[0] = fVar26;
      (pVVar12->field_0).m128[1] = fVar27;
      (pVVar12->field_0).m128[2] = fVar28;
      (pVVar12->field_0).m128[3] = fVar29;
      fVar24 = fVar24 + fVar26;
      fVar30 = fVar30 + fVar27;
      fVar31 = fVar31 + fVar28;
      fVar32 = fVar32 + fVar29;
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[3].face_valence;
    } while (uVar23 < uVar16);
  }
  uVar16 = (ulong)(this->ring).items[3].face_valence;
  if (uVar16 == 0) {
    uVar20 = 0;
    uVar16 = 0;
  }
  else {
    pDVar2 = &patch->items[3].ring.items[3].ring;
    uVar20 = 0;
    uVar23 = 0;
    do {
      uVar18 = (this->ring).items[3].eval_start_index + uVar23;
      uVar15 = 0;
      if (uVar16 <= uVar18) {
        uVar15 = uVar16;
      }
      lVar19 = uVar18 - uVar15;
      fVar26 = (this->ring).items[3].crease_weight.data[lVar19];
      if ((0x10 < lVar19 + 1U) &&
         ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[3].ring.items[3].crease_weight.data
          == &patch->items[3].ring.items[3].crease_weight)) {
        pfVar14 = (float *)operator_new__(0x100);
        patch->items[3].ring.items[3].crease_weight.data = pfVar14;
        lVar10 = 0;
        do {
          patch->items[3].ring.items[3].crease_weight.data[lVar10] =
               patch->items[3].ring.items[3].crease_weight.arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
      fVar27 = 0.0;
      if (0.0 <= fVar26 + -1.0) {
        fVar27 = fVar26 + -1.0;
      }
      patch->items[3].ring.items[3].crease_weight.data[lVar19] = fVar27;
      uVar16 = lVar19 * 2 - 1;
      if (uVar18 == uVar15) {
        uVar16 = (ulong)((this->ring).items[3].edge_valence - 1);
      }
      pVVar12 = (this->ring).items[3].ring.data + lVar19 * 2;
      fVar27 = (this->ring).items[3].vtx.field_0.m128[0] + (pVVar12->field_0).m128[0];
      fVar28 = (this->ring).items[3].vtx.field_0.m128[1] + (pVVar12->field_0).m128[1];
      fVar29 = (this->ring).items[3].vtx.field_0.m128[2] + (pVVar12->field_0).m128[2];
      fVar33 = (this->ring).items[3].vtx.field_0.m128[3] + (pVVar12->field_0).m128[3];
      if ((0x20 < uVar16 + 1) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)patch->items[3].ring.items[3].ring.data
          == pDVar2)) {
        pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar12;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      uVar15 = lVar19 * 2;
      pVVar12 = patch->items[3].ring.items[3].ring.data;
      if ((0x20 < uVar15 + 2) &&
         ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar12 == pDVar2)) {
        pVVar11 = (Vec3fa *)alignedMalloc(0x800,0x10);
        patch->items[3].ring.items[3].ring.data = pVVar11;
        lVar10 = 0;
        do {
          puVar5 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar8 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar5;
          puVar3[1] = uVar8;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x200);
      }
      pVVar12 = pVVar12 + uVar16;
      pVVar7 = patch->items[3].ring.items[3].ring.data;
      pVVar11 = pVVar7 + lVar19 * 2 + 1;
      fVar34 = (pVVar12->field_0).m128[0] + (pVVar11->field_0).m128[0];
      fVar35 = (pVVar12->field_0).m128[1] + (pVVar11->field_0).m128[1];
      fVar36 = (pVVar12->field_0).m128[2] + (pVVar11->field_0).m128[2];
      fVar37 = (pVVar12->field_0).m128[3] + (pVVar11->field_0).m128[3];
      pVVar12 = (this->ring).items[3].ring.data + lVar19 * 2;
      fVar24 = fVar24 + (pVVar12->field_0).m128[0];
      fVar30 = fVar30 + (pVVar12->field_0).m128[1];
      fVar31 = fVar31 + (pVVar12->field_0).m128[2];
      fVar32 = fVar32 + (pVVar12->field_0).m128[3];
      if (0.0 < fVar26) {
        local_238[uVar20] = lVar19;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[3].ring.items[3].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
        uVar20 = uVar20 + 1;
        pVVar12 = patch->items[3].ring.items[3].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27 * 0.5;
        (pVVar12->field_0).m128[1] = fVar28 * 0.5;
        (pVVar12->field_0).m128[2] = fVar29 * 0.5;
        (pVVar12->field_0).m128[3] = fVar33 * 0.5;
        if (fVar26 < 1.0) {
          fVar25 = 1.0 - fVar26;
          fVar27 = (fVar27 + fVar34) * 0.25 * fVar25 + fVar26 * fVar27 * 0.5;
          fVar28 = (fVar28 + fVar35) * 0.25 * fVar25 + fVar26 * fVar28 * 0.5;
          fVar29 = (fVar29 + fVar36) * 0.25 * fVar25 + fVar26 * fVar29 * 0.5;
          fVar26 = (fVar33 + fVar37) * 0.25 * fVar25 + fVar26 * fVar33 * 0.5;
          if ((0x20 < (uVar15 | 1)) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[3].ring.items[3].ring.data == pDVar2)) {
            pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[3].ring.items[3].ring.data = pVVar12;
            lVar10 = 0;
            do {
              puVar5 = (undefined8 *)
                       ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
              uVar8 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
              *puVar3 = *puVar5;
              puVar3[1] = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (lVar10 != 0x200);
          }
          goto LAB_00e4fecb;
        }
      }
      else {
        fVar27 = (fVar27 + fVar34) * 0.25;
        fVar28 = (fVar28 + fVar35) * 0.25;
        fVar29 = (fVar29 + fVar36) * 0.25;
        fVar26 = (fVar33 + fVar37) * 0.25;
        if ((0x20 < (uVar15 | 1)) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar2)) {
          pVVar12 = (Vec3fa *)alignedMalloc(0x800,0x10);
          patch->items[3].ring.items[3].ring.data = pVVar12;
          lVar10 = 0;
          do {
            puVar5 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar8 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar5;
            puVar3[1] = uVar8;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x200);
        }
LAB_00e4fecb:
        pVVar12 = patch->items[3].ring.items[3].ring.data + lVar19 * 2;
        (pVVar12->field_0).m128[0] = fVar27;
        (pVVar12->field_0).m128[1] = fVar28;
        (pVVar12->field_0).m128[2] = fVar29;
        (pVVar12->field_0).m128[3] = fVar26;
      }
      uVar23 = uVar23 + 1;
      uVar16 = (ulong)(this->ring).items[3].face_valence;
    } while (uVar23 < uVar16);
  }
  fVar27 = 1.0 / (float)uVar16;
  fVar26 = (float)uVar16 + -2.0;
  fVar28 = (fVar24 * fVar27 + fVar26 * (this->ring).items[3].vtx.field_0.m128[0]) * fVar27;
  fVar30 = (fVar30 * fVar27 + fVar26 * (this->ring).items[3].vtx.field_0.m128[1]) * fVar27;
  fVar31 = (fVar31 * fVar27 + fVar26 * (this->ring).items[3].vtx.field_0.m128[2]) * fVar27;
  fVar27 = (fVar32 * fVar27 + fVar26 * (this->ring).items[3].vtx.field_0.m128[3]) * fVar27;
  patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar28;
  patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar30;
  patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar31;
  patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar27;
  fVar24 = (this->ring).items[3].vertex_crease_weight;
  if (0.0 < fVar24) {
    if (1.0 <= fVar24) {
LAB_00e51e38:
      fVar32 = (this->ring).items[3].vtx.field_0.m128[0];
      fVar30 = (this->ring).items[3].vtx.field_0.m128[1];
      fVar31 = (this->ring).items[3].vtx.field_0.m128[2];
      fVar24 = (this->ring).items[3].vtx.field_0.m128[3];
    }
    else {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar24 * (this->ring).items[3].vtx.field_0.m128[0];
      fVar30 = fVar30 * fVar26 + fVar24 * (this->ring).items[3].vtx.field_0.m128[1];
      fVar31 = fVar31 * fVar26 + fVar24 * (this->ring).items[3].vtx.field_0.m128[2];
      fVar24 = fVar27 * fVar26 + fVar24 * (this->ring).items[3].vtx.field_0.m128[3];
    }
LAB_00e51e40:
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar32;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar30;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar31;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar24;
  }
  else if (1 < uVar20) {
    if (uVar20 != 2) goto LAB_00e51e38;
    pVVar11 = (this->ring).items[3].ring.data;
    pVVar12 = pVVar11 + local_238[0] * 2;
    pVVar11 = pVVar11 + local_238[1] * 2;
    fVar33 = ((this->ring).items[3].vtx.field_0.m128[0] * 6.0 + (pVVar12->field_0).m128[0] +
             (pVVar11->field_0).m128[0]) * 0.125;
    fVar34 = ((this->ring).items[3].vtx.field_0.m128[1] * 6.0 + (pVVar12->field_0).m128[1] +
             (pVVar11->field_0).m128[1]) * 0.125;
    fVar35 = ((this->ring).items[3].vtx.field_0.m128[2] * 6.0 + (pVVar12->field_0).m128[2] +
             (pVVar11->field_0).m128[2]) * 0.125;
    fVar36 = ((this->ring).items[3].vtx.field_0.m128[3] * 6.0 + (pVVar12->field_0).m128[3] +
             (pVVar11->field_0).m128[3]) * 0.125;
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar33;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar34;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar35;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar36;
    pfVar14 = (this->ring).items[3].crease_weight.data;
    fVar24 = pfVar14[local_238[0]];
    fVar32 = pfVar14[local_238[1]];
    fVar29 = (fVar24 * 3.0 + fVar32) * 0.25 + -1.0;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    pDVar1 = &patch->items[3].ring.items[3].crease_weight;
    if ((0x10 < local_238[0] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[3].ring.items[3].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[3].ring.items[3].crease_weight.data[lVar19] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    fVar29 = (fVar32 * 3.0 + fVar24) * 0.25 + -1.0;
    patch->items[3].ring.items[3].crease_weight.data[local_238[0]] = fVar26;
    fVar26 = 0.0;
    if (0.0 <= fVar29) {
      fVar26 = fVar29;
    }
    if ((0x10 < local_238[1] + 1U) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)patch->items[3].ring.items[3].crease_weight.data ==
        pDVar1)) {
      pfVar14 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar14;
      lVar19 = 0;
      do {
        patch->items[3].ring.items[3].crease_weight.data[lVar19] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
    }
    patch->items[3].ring.items[3].crease_weight.data[local_238[1]] = fVar26;
    fVar24 = (fVar24 + fVar32) * 0.5;
    if (fVar24 < 1.0) {
      fVar26 = 1.0 - fVar24;
      fVar32 = fVar28 * fVar26 + fVar33 * fVar24;
      fVar30 = fVar30 * fVar26 + fVar34 * fVar24;
      fVar31 = fVar31 * fVar26 + fVar35 * fVar24;
      fVar24 = fVar27 * fVar26 + fVar36 * fVar24;
      goto LAB_00e51e40;
    }
  }
  fVar24 = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].edge_level = fVar24;
  patch->items[0].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[0].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[0].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[1].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[1].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[2].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[2].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[3].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  iVar6 = (this->ring).items[0].border_index;
  uVar17 = (this->ring).items[0].edge_valence;
  uVar21 = (this->ring).items[1].face_valence;
  patch->items[0].ring.items[1].vertex_level = fVar24;
  patch->items[1].ring.items[0].vertex_level = fVar24;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[0].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[1].border_index = 2;
    patch->items[0].ring.items[1].face_valence = 3;
    patch->items[1].ring.items[0].border_index = 4;
    patch->items[1].ring.items[0].face_valence = 3;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar9;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (long)patch->items[0].ring.items[0].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[2] = fVar24;
    *patch->items[1].ring.items[0].crease_weight.data = fVar24;
    fVar24 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar24;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar21 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[0].ring.items[1].eval_start_index = 2;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_00e50937;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_00e50975:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar17;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[0].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[1].border_index = -1;
    patch->items[0].ring.items[1].face_valence = 4;
    patch->items[1].ring.items[0].border_index = -1;
    patch->items[1].ring.items[0].face_valence = 4;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar9;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[3] = fVar24;
    *patch->items[1].ring.items[0].crease_weight.data = fVar24;
    patch->items[0].ring.items[1].crease_weight.data[2] = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[3] = 0.0;
    fVar24 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar24;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar21 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[0].ring.items[1].eval_start_index = 3;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_00e50975;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_00e50937:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar21;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[1].border_index;
  uVar17 = (this->ring).items[1].edge_valence;
  uVar21 = (this->ring).items[2].face_valence;
  fVar24 = patch->items[1].ring.items[1].edge_level;
  patch->items[1].ring.items[2].vertex_level = fVar24;
  patch->items[2].ring.items[1].vertex_level = fVar24;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[1].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[2].border_index = 2;
    patch->items[1].ring.items[2].face_valence = 3;
    patch->items[2].ring.items[1].border_index = 4;
    patch->items[2].ring.items[1].face_valence = 3;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar9;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (long)patch->items[1].ring.items[1].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[2] = fVar24;
    *patch->items[2].ring.items[1].crease_weight.data = fVar24;
    fVar24 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar24;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar21 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[1].ring.items[2].eval_start_index = 2;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_00e50d5d;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_00e50d9b:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar17;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[1].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[2].border_index = -1;
    patch->items[1].ring.items[2].face_valence = 4;
    patch->items[2].ring.items[1].border_index = -1;
    patch->items[2].ring.items[1].face_valence = 4;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar9;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[1].ring.items[1].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[3] = fVar24;
    *patch->items[2].ring.items[1].crease_weight.data = fVar24;
    patch->items[1].ring.items[2].crease_weight.data[2] = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[3] = 0.0;
    fVar24 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar24;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar21 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[1].ring.items[2].eval_start_index = 3;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_00e50d9b;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_00e50d5d:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar21;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[2].border_index;
  uVar17 = (this->ring).items[2].edge_valence;
  uVar21 = (this->ring).items[3].face_valence;
  fVar24 = patch->items[2].ring.items[2].edge_level;
  patch->items[2].ring.items[3].vertex_level = fVar24;
  patch->items[3].ring.items[2].vertex_level = fVar24;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[2].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[3].border_index = 2;
    patch->items[2].ring.items[3].face_valence = 3;
    patch->items[3].ring.items[2].border_index = 4;
    patch->items[3].ring.items[2].face_valence = 3;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar9;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (long)patch->items[2].ring.items[2].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[2] = fVar24;
    *patch->items[3].ring.items[2].crease_weight.data = fVar24;
    fVar24 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar24;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar21 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar21 < uVar17) {
      patch->items[2].ring.items[3].eval_start_index = 2;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_00e51183;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_00e511c1:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar17;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar17;
  }
  else {
    patch->items[2].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[3].border_index = -1;
    patch->items[2].ring.items[3].face_valence = 4;
    patch->items[3].ring.items[2].border_index = -1;
    patch->items[3].ring.items[2].face_valence = 4;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar9;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[2].ring.items[2].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[3] = fVar24;
    *patch->items[3].ring.items[2].crease_weight.data = fVar24;
    patch->items[2].ring.items[3].crease_weight.data[2] = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[3] = 0.0;
    fVar24 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar24;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar21 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[2].ring.items[3].eval_start_index = 3;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_00e511c1;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_00e51183:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar21;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar21;
  }
  iVar6 = (this->ring).items[3].border_index;
  uVar17 = (this->ring).items[3].edge_valence;
  uVar21 = (this->ring).items[0].face_valence;
  fVar24 = patch->items[3].ring.items[3].edge_level;
  patch->items[3].ring.items[0].vertex_level = fVar24;
  patch->items[0].ring.items[3].vertex_level = fVar24;
  if (((ulong)uVar17 - 2 == (long)iVar6) || (uVar21 < 3)) {
    patch->items[3].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[0].border_index = 2;
    patch->items[3].ring.items[0].face_valence = 3;
    patch->items[0].ring.items[3].border_index = 4;
    patch->items[0].ring.items[3].face_valence = 3;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar9;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (long)patch->items[3].ring.items[3].border_index + 1;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[2] = fVar24;
    *patch->items[0].ring.items[3].crease_weight.data = fVar24;
    fVar24 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar24;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar21 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[3].ring.items[0].eval_start_index = 1;
      patch->items[0].ring.items[3].eval_start_index = 2;
      goto LAB_00e515e4;
    }
    patch->items[3].ring.items[0].eval_start_index = 2;
    patch->items[0].ring.items[3].eval_start_index = 0;
  }
  else {
    patch->items[3].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[0].border_index = -1;
    patch->items[3].ring.items[0].face_valence = 4;
    patch->items[0].ring.items[3].border_index = -1;
    patch->items[0].ring.items[3].face_valence = 4;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar9;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar8;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar9;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar8 = *(undefined8 *)&pVVar12[1].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[1].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12->field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12->field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[0].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[4].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[4].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[7].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[7].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 1);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[6].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[6].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 2);
    uVar8 = *(undefined8 *)&pVVar12->field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12->field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[5].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[5].field_0 + 8) = uVar9;
    uVar8 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar9 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[2].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[2].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[4].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[4].field_0 + 8) = uVar9;
    pVVar12 = patch->items[3].ring.items[3].ring.data;
    uVar8 = *(undefined8 *)&pVVar12[2].field_0;
    uVar9 = *(undefined8 *)((long)&pVVar12[2].field_0 + 8);
    pVVar12 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar12[1].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[1].field_0 + 8) = uVar9;
    pVVar12 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar12[3].field_0 = uVar8;
    *(undefined8 *)((long)&pVVar12[3].field_0 + 8) = uVar9;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar24 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[3] = fVar24;
    *patch->items[0].ring.items[3].crease_weight.data = fVar24;
    patch->items[3].ring.items[0].crease_weight.data[2] = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[3] = 0.0;
    fVar24 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar24;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar24;
    uVar17 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar21 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar17 <= uVar21) {
      patch->items[3].ring.items[0].eval_start_index = 3;
      patch->items[0].ring.items[3].eval_start_index = 0;
LAB_00e515e4:
      patch->items[3].ring.items[0].eval_unique_identifier = uVar17;
      patch->items[0].ring.items[3].eval_unique_identifier = uVar17;
      goto LAB_00e515f2;
    }
    patch->items[3].ring.items[0].eval_start_index = 1;
    patch->items[0].ring.items[3].eval_start_index = 2;
  }
  patch->items[3].ring.items[0].eval_unique_identifier = uVar21;
  patch->items[0].ring.items[3].eval_unique_identifier = uVar21;
LAB_00e515f2:
  fVar24 = ((this->ring).items[0].vtx.field_0.m128[0] + (this->ring).items[1].vtx.field_0.m128[0] +
            (this->ring).items[2].vtx.field_0.m128[0] + (this->ring).items[3].vtx.field_0.m128[0]) *
           0.25;
  fVar30 = ((this->ring).items[0].vtx.field_0.m128[1] + (this->ring).items[1].vtx.field_0.m128[1] +
            (this->ring).items[2].vtx.field_0.m128[1] + (this->ring).items[3].vtx.field_0.m128[1]) *
           0.25;
  fVar31 = ((this->ring).items[0].vtx.field_0.m128[2] + (this->ring).items[1].vtx.field_0.m128[2] +
            (this->ring).items[2].vtx.field_0.m128[2] + (this->ring).items[3].vtx.field_0.m128[2]) *
           0.25;
  fVar32 = ((this->ring).items[0].vtx.field_0.m128[3] + (this->ring).items[1].vtx.field_0.m128[3] +
            (this->ring).items[2].vtx.field_0.m128[3] + (this->ring).items[3].vtx.field_0.m128[3]) *
           0.25;
  pVVar12 = patch->items[3].ring.items[3].ring.data;
  local_238[0] = *(long *)&pVVar12->field_0;
  local_238[1] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[0xe] = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
  local_238[0xf] = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
  pVVar12 = patch->items[2].ring.items[2].ring.data;
  local_238[0xc] = *(undefined8 *)&pVVar12->field_0;
  local_238[0xd] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[10] = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
  local_238[0xb] = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
  pVVar12 = patch->items[1].ring.items[1].ring.data;
  local_238[8] = *(undefined8 *)&pVVar12->field_0;
  local_238[9] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[6] = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
  local_238[7] = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
  pVVar12 = patch->items[0].ring.items[0].ring.data;
  local_238[4] = *(undefined8 *)&pVVar12->field_0;
  local_238[5] = *(undefined8 *)((long)&pVVar12->field_0 + 8);
  local_238[2] = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
  local_238[3] = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
  patch->items[0].ring.items[2].vertex_level = 0.0;
  patch->items[0].ring.items[2].border_index = -1;
  patch->items[0].ring.items[2].face_valence = 4;
  patch->items[0].ring.items[2].edge_valence = 8;
  patch->items[0].ring.items[2].vertex_crease_weight = 0.0;
  patch->items[0].ring.items[2].vtx.field_0.m128[0] = fVar24;
  patch->items[0].ring.items[2].vtx.field_0.m128[1] = fVar30;
  patch->items[0].ring.items[2].vtx.field_0.m128[2] = fVar31;
  patch->items[0].ring.items[2].vtx.field_0.m128[3] = fVar32;
  lVar19 = 0;
  do {
    uVar8 = *(undefined8 *)((long)local_238 + lVar19 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[2].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + lVar19);
    puVar3[1] = uVar8;
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x80);
  lVar19 = 0;
  do {
    patch->items[0].ring.items[2].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[0].ring.items[2].eval_start_index = 4;
  uVar17 = patch->items[0].ring.items[2].face_valence;
  if (uVar17 < 5) {
    patch->items[0].ring.items[2].eval_start_index = 4 - uVar17;
  }
  lVar19 = 0;
  patch->items[0].ring.items[2].eval_unique_identifier = 0;
  patch->items[1].ring.items[3].vertex_level = 0.0;
  patch->items[1].ring.items[3].border_index = -1;
  patch->items[1].ring.items[3].face_valence = 4;
  patch->items[1].ring.items[3].edge_valence = 8;
  patch->items[1].ring.items[3].vertex_crease_weight = 0.0;
  patch->items[1].ring.items[3].vtx.field_0.m128[0] = fVar24;
  patch->items[1].ring.items[3].vtx.field_0.m128[1] = fVar30;
  patch->items[1].ring.items[3].vtx.field_0.m128[2] = fVar31;
  patch->items[1].ring.items[3].vtx.field_0.m128[3] = fVar32;
  lVar10 = 2;
  do {
    uVar16 = (ulong)(((uint)lVar10 & 7) << 4);
    uVar8 = *(undefined8 *)((long)local_238 + uVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[3].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + uVar16);
    puVar3[1] = uVar8;
    lVar10 = lVar10 + 1;
    lVar19 = lVar19 + 0x10;
  } while (lVar10 != 10);
  lVar19 = 0;
  do {
    patch->items[1].ring.items[3].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[1].ring.items[3].eval_start_index = 3;
  uVar17 = patch->items[1].ring.items[3].face_valence;
  if (uVar17 < 4) {
    patch->items[1].ring.items[3].eval_start_index = 3 - uVar17;
  }
  lVar19 = 0;
  patch->items[1].ring.items[3].eval_unique_identifier = 0;
  patch->items[2].ring.items[0].vertex_level = 0.0;
  patch->items[2].ring.items[0].border_index = -1;
  patch->items[2].ring.items[0].face_valence = 4;
  patch->items[2].ring.items[0].edge_valence = 8;
  patch->items[2].ring.items[0].vertex_crease_weight = 0.0;
  patch->items[2].ring.items[0].vtx.field_0.m128[0] = fVar24;
  patch->items[2].ring.items[0].vtx.field_0.m128[1] = fVar30;
  patch->items[2].ring.items[0].vtx.field_0.m128[2] = fVar31;
  patch->items[2].ring.items[0].vtx.field_0.m128[3] = fVar32;
  uVar16 = 0;
  do {
    uVar20 = uVar16 ^ 4;
    lVar10 = local_238[uVar20 * 2 + 1];
    uVar16 = uVar16 + 1;
    plVar4 = (long *)((long)&(patch->items[2].ring.items[0].ring.data)->field_0 + lVar19);
    *plVar4 = local_238[uVar20 * 2];
    plVar4[1] = lVar10;
    lVar19 = lVar19 + 0x10;
  } while (uVar16 != 8);
  lVar19 = 0;
  do {
    patch->items[2].ring.items[0].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[2].ring.items[0].eval_start_index = 2;
  uVar17 = patch->items[2].ring.items[0].face_valence;
  if (uVar17 < 3) {
    patch->items[2].ring.items[0].eval_start_index = 2 - uVar17;
  }
  lVar19 = 0;
  patch->items[2].ring.items[0].eval_unique_identifier = 0;
  patch->items[3].ring.items[1].vertex_level = 0.0;
  patch->items[3].ring.items[1].border_index = -1;
  patch->items[3].ring.items[1].face_valence = 4;
  patch->items[3].ring.items[1].edge_valence = 8;
  patch->items[3].ring.items[1].vertex_crease_weight = 0.0;
  patch->items[3].ring.items[1].vtx.field_0.m128[0] = fVar24;
  patch->items[3].ring.items[1].vtx.field_0.m128[1] = fVar30;
  patch->items[3].ring.items[1].vtx.field_0.m128[2] = fVar31;
  patch->items[3].ring.items[1].vtx.field_0.m128[3] = fVar32;
  lVar10 = 6;
  do {
    uVar16 = (ulong)(((uint)lVar10 & 7) << 4);
    uVar8 = *(undefined8 *)((long)local_238 + uVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[1].ring.data)->field_0 + lVar19);
    *puVar3 = *(undefined8 *)((long)local_238 + uVar16);
    puVar3[1] = uVar8;
    lVar10 = lVar10 + 1;
    lVar19 = lVar19 + 0x10;
  } while (lVar10 != 0xe);
  lVar19 = 0;
  do {
    patch->items[3].ring.items[1].crease_weight.data[lVar19] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  patch->items[3].ring.items[1].eval_start_index = 1;
  uVar17 = patch->items[3].ring.items[1].face_valence;
  if (uVar17 < 2) {
    patch->items[3].ring.items[1].eval_start_index = 1 - uVar17;
  }
  patch->items[3].ring.items[1].eval_unique_identifier = 0;
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatchT,4>& patch) const
    {
      ring[0].subdivide(patch[0].ring[0]);
      ring[1].subdivide(patch[1].ring[1]);
      ring[2].subdivide(patch[2].ring[2]);
      ring[3].subdivide(patch[3].ring[3]);
      
      patch[0].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[0].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[0].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[0].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      patch[1].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[1].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[1].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[1].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[2].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[2].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[2].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[2].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[3].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[3].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[3].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[3].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      const bool regular0 = ring[0].has_last_face() && ring[1].face_valence > 2;
      if (likely(regular0))
        init_regular(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      else
        init_border(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      
      const bool regular1 = ring[1].has_last_face() && ring[2].face_valence > 2;
      if (likely(regular1))
        init_regular(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      else
        init_border(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      
      const bool regular2 = ring[2].has_last_face() && ring[3].face_valence > 2;
      if (likely(regular2))
        init_regular(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      else
        init_border(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      
      const bool regular3 = ring[3].has_last_face() && ring[0].face_valence > 2;
      if (likely(regular3))
        init_regular(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      else
        init_border(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      
      Vertex_t center = (ring[0].vtx + ring[1].vtx + ring[2].vtx + ring[3].vtx) * 0.25f;

      Vertex_t center_ring[8];
      center_ring[0] = (Vertex_t)patch[3].ring[3].ring[0];
      center_ring[7] = (Vertex_t)patch[3].ring[3].vtx;
      center_ring[6] = (Vertex_t)patch[2].ring[2].ring[0];
      center_ring[5] = (Vertex_t)patch[2].ring[2].vtx;
      center_ring[4] = (Vertex_t)patch[1].ring[1].ring[0];
      center_ring[3] = (Vertex_t)patch[1].ring[1].vtx;
      center_ring[2] = (Vertex_t)patch[0].ring[0].ring[0];
      center_ring[1] = (Vertex_t)patch[0].ring[0].vtx;
      
      init_regular(center,center_ring,0,patch[0].ring[2]);
      init_regular(center,center_ring,2,patch[1].ring[3]);
      init_regular(center,center_ring,4,patch[2].ring[0]);
      init_regular(center,center_ring,6,patch[3].ring[1]);
      
      assert(patch[0].verify());
      assert(patch[1].verify());
      assert(patch[2].verify());
      assert(patch[3].verify());
    }